

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O3

void record_shader_modules(StateRecorder *recorder)

{
  bool bVar1;
  VkShaderModuleCreateInfo local_38;
  
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  local_38._20_4_ = 0;
  local_38.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_38._4_4_ = 0;
  local_38.pCode = record_shader_modules::code;
  local_38.codeSize = 8;
  bVar1 = Fossilize::StateRecorder::record_shader_module
                    (recorder,(VkShaderModule)&DAT_00001388,&local_38,0);
  if (bVar1) {
    local_38.pCode = record_shader_modules::code2;
    local_38.codeSize = 0x10;
    bVar1 = Fossilize::StateRecorder::record_shader_module
                      (recorder,(VkShaderModule)&DAT_00001389,&local_38,0);
    if (bVar1) {
      return;
    }
  }
  abort();
}

Assistant:

static void record_shader_modules(StateRecorder &recorder)
{
	VkShaderModuleCreateInfo info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
	static const uint32_t code[] = { 0xdeadbeef, 0xcafebabe };
	info.pCode = code;
	info.codeSize = sizeof(code);

	if (!recorder.record_shader_module(fake_handle<VkShaderModule>(5000), info))
		abort();

	static const uint32_t code2[] = { 0xabba1337, 0xbabba100, 0xdeadbeef, 0xcafebabe };
	info.pCode = code2;
	info.codeSize = sizeof(code2);
	if (!recorder.record_shader_module(fake_handle<VkShaderModule>(5001), info))
		abort();
}